

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O0

ostream * pstack::operator<<(ostream *os,JSON<pstack::Dwarf::LineState,_char> *jo)

{
  JObject *pJVar1;
  ostream *poVar2;
  char local_46 [21];
  char local_31;
  JObject local_30;
  LineState *local_20;
  LineState *ls;
  JSON<pstack::Dwarf::LineState,_char> *jo_local;
  ostream *os_local;
  
  local_20 = jo->object;
  ls = (LineState *)jo;
  jo_local = (JSON<pstack::Dwarf::LineState,_char> *)os;
  JObject::JObject(&local_30,os);
  local_31 = '\0';
  pJVar1 = JObject::field<char[5],pstack::Dwarf::FileEntry,char>
                     (&local_30,(char (*) [5])0x2a5e69,local_20->file,&local_31);
  local_46[1] = 0;
  pJVar1 = JObject::field<char[5],unsigned_int,char>
                     (pJVar1,(char (*) [5])0x2a5c5a,&local_20->line,local_46 + 1);
  local_46[0] = '\0';
  pJVar1 = JObject::field<char[5],unsigned_long,char>
                     (pJVar1,(char (*) [5])0x2a7675,&local_20->addr,local_46);
  poVar2 = JObject::operator_cast_to_ostream_(pJVar1);
  JObject::~JObject(&local_30);
  return poVar2;
}

Assistant:

std::ostream &operator << (std::ostream &os, const JSON<Dwarf::LineState, C> &jo) {
    auto &ls = jo.object;
    return JObject(os)
        .field("file", *ls.file)
        .field("line", ls.line)
        .field("addr", ls.addr);
}